

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int fl_ready(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  fd_set *pfVar4;
  fd_set *pfVar5;
  byte bVar6;
  timeval local_198;
  fd_set fdt [3];
  
  bVar6 = 0;
  iVar1 = XQLength(fl_display);
  if (iVar1 == 0) {
    if (nfds == 0) {
      iVar1 = 0;
    }
    else {
      local_198.tv_sec = 0;
      local_198.tv_usec = 0;
      lVar3 = 0x10;
      pfVar4 = fdsets;
      pfVar5 = (fd_set *)fdt;
      for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pfVar4 = fdsets + 1;
      pfVar5 = (fd_set *)(fdt + 1);
      for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pfVar4 = fdsets + 2;
      pfVar5 = (fd_set *)(fdt + 2);
      for (; lVar3 != 0; lVar3 = lVar3 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      iVar1 = select(maxfd + 1,(fd_set *)fdt,(fd_set *)(fdt + 1),(fd_set *)(fdt + 2),&local_198);
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int fl_ready() {
  if (XQLength(fl_display)) return 1;
  if (!nfds) return 0; // nothing to select or poll
#  if USE_POLL
  return ::poll(pollfds, nfds, 0);
#  else
  timeval t;
  t.tv_sec = 0;
  t.tv_usec = 0;
  fd_set fdt[3];
  fdt[0] = fdsets[0];
  fdt[1] = fdsets[1];
  fdt[2] = fdsets[2];
  return ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],&t);
#  endif
}